

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ab78d::AV1HighbdCompMaskPredTestBase::SetUp
          (AV1HighbdCompMaskPredTestBase *this)

{
  bool bVar1;
  char *file;
  void *pvVar2;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_ffffffffffffff0c;
  AssertHelper *in_stack_ffffffffffffff10;
  unsigned_short **in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int line;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_a8 [2];
  undefined8 local_88;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_58;
  uint local_44;
  undefined8 local_20;
  AssertionResult local_18;
  
  file = (char *)(in_RDI + 0x10);
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset((ACMRandom *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  av1_init_wedge_masks();
  pvVar2 = aom_memalign((size_t)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
  *(void **)(in_RDI + 0x18) = pvVar2;
  local_20 = 0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             &in_stack_ffffffffffffff10->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff28 =
         testing::AssertionResult::failure_message((AssertionResult *)0xab104a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,(Type)((ulong)in_RDI >> 0x20),file,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0xab10a7);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xab112e);
  if (local_44 == 0) {
    pvVar2 = aom_memalign((size_t)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
    *(void **)(in_RDI + 0x20) = pvVar2;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               &in_stack_ffffffffffffff10->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff20 =
           testing::AssertionResult::failure_message((AssertionResult *)0xab11d1);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff40,(Type)((ulong)in_RDI >> 0x20),file,
                 (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
      testing::Message::~Message((Message *)0xab122e);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xab12b5);
    if (local_44 == 0) {
      pvVar2 = aom_memalign((size_t)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
      *(void **)(in_RDI + 0x28) = pvVar2;
      local_88 = 0;
      testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 &in_stack_ffffffffffffff10->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff18 =
             (unsigned_short **)
             testing::AssertionResult::failure_message((AssertionResult *)0xab1346);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff40,(Type)((ulong)in_RDI >> 0x20),file,
                   (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
        testing::Message::~Message((Message *)0xab1394);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xab140f);
      if (local_44 == 0) {
        pvVar2 = aom_memalign((size_t)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        *(void **)(in_RDI + 0x30) = pvVar2;
        testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   &in_stack_ffffffffffffff10->data_);
        line = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff40);
          this_00 = (AssertHelper *)
                    testing::AssertionResult::failure_message((AssertionResult *)0xab149d);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_ffffffffffffff40,(Type)((ulong)in_RDI >> 0x20),file,line,
                     in_stack_ffffffffffffff20);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper(this_00);
          testing::Message::~Message((Message *)0xab14eb);
        }
        local_44 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xab1566);
        if (local_44 == 0) {
          *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x30) + 0x306;
        }
      }
    }
  }
  return;
}

Assistant:

void AV1HighbdCompMaskPredTestBase::SetUp() {
  rnd_.Reset(libaom_test::ACMRandom::DeterministicSeed());
  av1_init_wedge_masks();

  comp_pred1_ =
      (uint16_t *)aom_memalign(16, MAX_SB_SQUARE * sizeof(*comp_pred1_));
  ASSERT_NE(comp_pred1_, nullptr);
  comp_pred2_ =
      (uint16_t *)aom_memalign(16, MAX_SB_SQUARE * sizeof(*comp_pred2_));
  ASSERT_NE(comp_pred2_, nullptr);
  pred_ = (uint16_t *)aom_memalign(16, MAX_SB_SQUARE * sizeof(*pred_));
  ASSERT_NE(pred_, nullptr);
  // The biggest block size is MAX_SB_SQUARE(128*128), however for the
  // convolution we need to access 3 elements before and 4 elements after (for
  // an 8-tap filter), in both directions, so we need to allocate (128 + 7) *
  // (128 + 7) = (MAX_SB_SQUARE + (14 * MAX_SB_SIZE) + 49) *
  // sizeof(*ref_buffer_)
  ref_buffer_ = (uint16_t *)aom_memalign(
      16, (MAX_SB_SQUARE + (14 * MAX_SB_SIZE) + 49) * sizeof(*ref_buffer_));
  ASSERT_NE(ref_buffer_, nullptr);
  // Start of the actual block where the convolution will be computed
  ref_ = ref_buffer_ + (3 * MAX_SB_SIZE + 3);
}